

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O2

void build_obmc_inter_pred_left
               (MACROBLOCKD *xd,int rel_mi_row,int rel_mi_col,uint8_t op_mi_size,int dir,
               MB_MODE_INFO *left_mi,void *fun_ctxt,int num_planes)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint8_t *puVar9;
  _func_void_uint8_t_ptr_uint32_t_uint8_t_ptr_uint32_t_uint8_t_ptr_uint32_t_uint8_t_ptr_int_int
  **pp_Var10;
  int *piVar11;
  ulong uVar12;
  uint length;
  int iVar13;
  
  uVar8 = (ulong)(*xd->mi)->bsize;
  if ((0x1f07ffUL >> (uVar8 & 0x3f) & 1) == 0) {
    uVar6 = 0x20;
  }
  else {
    uVar6 = (uint)(block_size_wide[uVar8] >> 1);
  }
  uVar12 = 0;
  uVar8 = (ulong)(uint)num_planes;
  if (num_planes < 1) {
    uVar8 = uVar12;
  }
  piVar11 = &xd->plane[0].subsampling_x;
  for (; uVar8 != uVar12; uVar12 = uVar12 + 1) {
    length = uVar6 >> ((byte)*piVar11 & 0x1f);
    iVar5 = piVar11[1];
    iVar7 = (rel_mi_row << 2) >> ((byte)iVar5 & 0x1f);
    uVar1 = piVar11[9];
    puVar3 = ((buf_2d *)(piVar11 + 3))->buf;
    uVar2 = *(uint32_t *)(*(long *)((long)fun_ctxt + 8) + uVar12 * 4);
    lVar4 = *(long *)(*fun_ctxt + uVar12 * 8);
    iVar13 = 0x333d47;
    puVar9 = av1_get_obmc_mask(length);
    if ((xd->cur_buf->flags & 8) == 0) {
      pp_Var10 = &aom_blend_a64_hmask;
    }
    else {
      iVar13 = xd->bd;
      pp_Var10 = (_func_void_uint8_t_ptr_uint32_t_uint8_t_ptr_uint32_t_uint8_t_ptr_uint32_t_uint8_t_ptr_int_int
                  **)&aom_highbd_blend_a64_hmask;
    }
    (**pp_Var10)(puVar3 + (int)(iVar7 * uVar1),uVar1,puVar3 + (int)(iVar7 * uVar1),uVar1,
                 (uint8_t *)((int)(iVar7 * uVar2) + lVar4),uVar2,puVar9,length,
                 ((uint)op_mi_size << 2) >> ((byte)iVar5 & 0x1f),iVar13);
    piVar11 = piVar11 + 0x28c;
  }
  return;
}

Assistant:

static inline void build_obmc_inter_pred_left(
    MACROBLOCKD *xd, int rel_mi_row, int rel_mi_col, uint8_t op_mi_size,
    int dir, MB_MODE_INFO *left_mi, void *fun_ctxt, const int num_planes) {
  (void)left_mi;
  (void)rel_mi_col;
  (void)dir;
  struct obmc_inter_pred_ctxt *ctxt = (struct obmc_inter_pred_ctxt *)fun_ctxt;
  const BLOCK_SIZE bsize = xd->mi[0]->bsize;
  const int overlap =
      AOMMIN(block_size_wide[bsize], block_size_wide[BLOCK_64X64]) >> 1;

  for (int plane = 0; plane < num_planes; ++plane) {
    const struct macroblockd_plane *pd = &xd->plane[plane];
    const int bw = overlap >> pd->subsampling_x;
    const int bh = (op_mi_size * MI_SIZE) >> pd->subsampling_y;
    const int plane_row = (rel_mi_row * MI_SIZE) >> pd->subsampling_y;

    if (av1_skip_u4x4_pred_in_obmc(bsize, pd, 1)) continue;

    const int dst_stride = pd->dst.stride;
    uint8_t *const dst = &pd->dst.buf[plane_row * dst_stride];
    const int tmp_stride = ctxt->adjacent_stride[plane];
    const uint8_t *const tmp = &ctxt->adjacent[plane][plane_row * tmp_stride];
    const uint8_t *const mask = av1_get_obmc_mask(bw);

#if CONFIG_AV1_HIGHBITDEPTH
    const int is_hbd = is_cur_buf_hbd(xd);
    if (is_hbd)
      aom_highbd_blend_a64_hmask(dst, dst_stride, dst, dst_stride, tmp,
                                 tmp_stride, mask, bw, bh, xd->bd);
    else
      aom_blend_a64_hmask(dst, dst_stride, dst, dst_stride, tmp, tmp_stride,
                          mask, bw, bh);
#else
    aom_blend_a64_hmask(dst, dst_stride, dst, dst_stride, tmp, tmp_stride, mask,
                        bw, bh);
#endif
  }
}